

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

void __thiscall
helics::ActionMessage::ActionMessage(ActionMessage *this,vector<char,_std::allocator<char>_> *bytes)

{
  ActionMessage(this);
  from_vector(this,bytes);
  return;
}

Assistant:

ActionMessage::ActionMessage(const std::vector<char>& bytes): ActionMessage()
{
    from_vector(bytes);
}